

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_for_testing.hpp
# Opt level: O3

void HelpersForTests::print_nz_inds<std::array<bool,6144ul>>(array<bool,_6144UL> *vec)

{
  undefined8 in_RAX;
  ostream *poVar1;
  long lVar2;
  undefined8 uStack_28;
  
  lVar2 = 0;
  uStack_28 = in_RAX;
  do {
    if (vec->_M_elems[lVar2] == true) {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x1800);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void print_nz_inds(const T &vec) {
        std::size_t i{};
        for (auto val : vec) {
            if (val != 0) {
                std::cout << i << ' ';
            }
            i++;
        }
        std::cout << std::endl;
    }